

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

ResolvedTrace * __thiscall
backward::TraceResolverImplBase::resolve
          (ResolvedTrace *__return_storage_ptr__,TraceResolverImplBase *this,ResolvedTrace *t)

{
  ResolvedTrace::ResolvedTrace(__return_storage_ptr__,t);
  return __return_storage_ptr__;
}

Assistant:

virtual ResolvedTrace resolve(ResolvedTrace t) { return t; }